

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O2

void wait_for_comm_processes(void)

{
  undefined3 uVar1;
  uint uVar2;
  int c;
  int c_00;
  uint uVar3;
  uchar local_2e;
  byte bStack_2d;
  byte bStack_2c;
  byte bStack_2b;
  undefined1 uStack_2a;
  undefined1 local_29;
  
  bStack_2d = 0;
  bStack_2c = 0;
  bStack_2b = 0;
  uStack_2a = 0;
  local_29 = 0;
  local_2e = 'W';
  write(UnixPipeOut,&local_2e,6);
  SAFEREAD(UnixPipeIn,&local_2e,c);
  uVar1 = CONCAT12(uStack_2a,CONCAT11(bStack_2d,local_2e) << 8 | (ushort)bStack_2d);
  while (CONCAT13(local_29,uVar1) != 0) {
    uVar2 = find_process_slot(CONCAT13(local_29,uVar1));
    if (-1 < (int)uVar2) {
      uVar3 = (uint)bStack_2b;
      if (bStack_2c != 0) {
        uVar3 = (uint)bStack_2c << 8;
      }
      UJ[uVar2].status = uVar3;
    }
    bStack_2d = 0;
    bStack_2c = 0;
    bStack_2b = 0;
    uStack_2a = 0;
    local_29 = 0;
    local_2e = 'W';
    write(UnixPipeOut,&local_2e,6);
    SAFEREAD(UnixPipeIn,&local_2e,c_00);
    uVar1 = CONCAT12(uStack_2a,CONCAT11(bStack_2d,local_2e) << 8 | (ushort)bStack_2d);
  }
  return;
}

Assistant:

void wait_for_comm_processes(void) {
  int pid;
  int slot;
  unsigned char d[6];

  memset(d, 0, sizeof(d));
  d[0] = 'W';
  write(UnixPipeOut, d, 6);
  SAFEREAD(UnixPipeIn, d, 6);

  pid = (d[0] << 8) | d[1] | (d[4] << 16) | (d[5] << 24);
  while (pid != 0) {
    slot = find_process_slot(pid);
    /* Ignore processes that we didn't start (shouldn't happen but
       occasionally does) */
    if (slot >= 0) {
      if (d[2] == 0) {
        DBPRINT(("Process %d exited status %d\n", pid, d[3]));
        UJ[slot].status = d[3];
      } else {
        DBPRINT(("Process %d terminated with signal %d\n", pid, d[2]));
        UJ[slot].status = (d[2] << 8);
      }
    }
    /* Look for another stopped process. */
    memset(d, 0, sizeof(d));
    d[0] = 'W';
    write(UnixPipeOut, d, 6);
    SAFEREAD(UnixPipeIn, d, 6);

    pid = (d[0] << 8) | d[1] | (d[4] << 16) | (d[5] << 24);
  }
}